

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_parse.c
# Opt level: O0

int mpt_node_parse(mpt_node *conf,FILE *file,char *format,char *limits,mpt_logger *log)

{
  mpt_node *pmVar1;
  undefined1 local_a0 [8];
  mpt_node root;
  int res;
  mpt_node *old;
  mpt_parser_context parse;
  mpt_logger *log_local;
  char *limits_local;
  char *format_local;
  FILE *file_local;
  mpt_node *conf_local;
  
  old = (mpt_node *)0x0;
  parse.src.getc = (_func_int_void_ptr *)0x0;
  parse.src.arg = (void *)0x1;
  parse.src.line = 0xff00ff;
  parse._24_8_ = log;
  if (file == (FILE *)0x0) {
    if (log != (mpt_logger *)0x0) {
      mpt_log(log,"mpt_node_parse",3,"%s","bad file argument");
    }
    conf_local._4_4_ = -1;
  }
  else {
    log_local = (mpt_logger *)limits;
    if (limits == (char *)0x0) {
      log_local = (mpt_logger *)anon_var_dwarf_1c44d;
    }
    old = (mpt_node *)mpt_getchar_stdio;
    parse.src.getc = (_func_int_void_ptr *)file;
    root.ident._base._4_4_ = mpt_parse_accept((mpt_parser_allow *)&parse.src.line,(char *)log_local)
    ;
    if (root.ident._base._4_4_ < 0) {
      if (parse._24_8_ != 0) {
        mpt_log((mpt_logger *)parse._24_8_,"mpt_node_parse",3,"%s: %s","bad name limits",log_local);
      }
      conf_local._4_4_ = -1;
    }
    else {
      pmVar1 = conf->children;
      conf->children = (mpt_node *)0x0;
      root.ident._base._4_4_ = mpt_parse_node(conf,(mpt_parser_context *)&old,format);
      if (root.ident._base._4_4_ < 0) {
        conf->children = pmVar1;
        if (parse._24_8_ != 0) {
          mpt_log((mpt_logger *)parse._24_8_,"mpt_node_parse",3,"%s (%x): %s %u","parse error",
                  parse.src.line >> 0x38,"line",(int)parse.src.arg);
        }
        conf_local._4_4_ = root.ident._base._4_4_;
      }
      else {
        memset(local_a0,0,0x38);
        root.children._3_1_ = 0xc;
        root.parent = pmVar1;
        mpt_node_clear((mpt_node *)local_a0);
        conf_local._4_4_ = root.ident._base._4_4_;
      }
    }
  }
  return conf_local._4_4_;
}

Assistant:

extern int mpt_node_parse(MPT_STRUCT(node) *conf, FILE *file, const char *format, const char *limits, MPT_INTERFACE(logger) *log)
{
	MPT_STRUCT(parser_context) parse = MPT_PARSER_INIT;
	MPT_STRUCT(node) *old;
	int res;
	
	if (!file) {
		if (log) mpt_log(log, __func__, MPT_LOG(Error), "%s", MPT_tr("bad file argument"));
		return MPT_ERROR(BadArgument);
	}
	if (!limits) {
		limits = "ns";
	}
	parse.src.getc = (int (*)()) mpt_getchar_stdio;
	parse.src.arg  = file;
	if ((res = mpt_parse_accept(&parse.name, limits)) < 0) {
		if (log) mpt_log(log, __func__, MPT_LOG(Error), "%s: %s", MPT_tr("bad name limits"), limits);
		return MPT_ERROR(BadArgument);
	}
	
	/* clear children to trigger non-merge read */
	old = conf->children;
	conf->children = 0;
	
	res = mpt_parse_node(conf, &parse, format);
	/* replace tree content */
	if (res >= 0) {
		MPT_STRUCT(node) root = MPT_NODE_INIT;
		root.children = old;
		mpt_node_clear(&root);
		
		return res;
	}
	/* restore old subtree base */
	conf->children = old;
	
	if (log) {
		mpt_log(log, __func__, MPT_LOG(Error), "%s (%x): %s %u",
		        MPT_tr("parse error"), parse.curr, MPT_tr("line"), (int) parse.src.line);
	}
	return res;
}